

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngx_string.c
# Opt level: O3

size_t ngx_utf8_length(u_char *p,size_t n)

{
  uint32_t uVar1;
  size_t sVar2;
  u_char *local_30;
  u_char *p_local;
  
  if ((long)n < 1) {
    sVar2 = 0;
  }
  else {
    sVar2 = 0;
    local_30 = p;
    do {
      if ((char)*local_30 < '\0') {
        uVar1 = ngx_utf8_decode(&local_30,n);
        if (0x10ffff < uVar1) {
          return n;
        }
      }
      else {
        local_30 = local_30 + 1;
      }
      sVar2 = sVar2 + 1;
    } while (local_30 < p + n);
  }
  return sVar2;
}

Assistant:

size_t
ngx_utf8_length(u_char *p, size_t n)
{
    u_char  c, *last;
    size_t  len;

    last = p + n;

    for (len = 0; p < last; len++) {

        c = *p;

        if (c < 0x80) {
            p++;
            continue;
        }

        if (ngx_utf8_decode(&p, n) > 0x10ffff) {
            /* invalid UTF-8 */
            return n;
        }
    }

    return len;
}